

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

void __thiscall duckdb::RegexpBaseBindData::RegexpBaseBindData(RegexpBaseBindData *this)

{
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__RegexpBaseBindData_0247fb28;
  (this->options).max_mem_ = 0x800000;
  (this->options).encoding_ = EncodingUTF8;
  (this->options).posix_syntax_ = false;
  (this->options).longest_match_ = false;
  (this->options).log_errors_ = true;
  (this->options).literal_ = false;
  (this->options).never_nl_ = false;
  (this->options).dot_nl_ = false;
  (this->options).never_capture_ = false;
  (this->options).case_sensitive_ = true;
  (this->options).perl_classes_ = false;
  (this->options).word_boundary_ = false;
  (this->options).one_line_ = false;
  (this->constant_string)._M_dataplus._M_p = (pointer)&(this->constant_string).field_2;
  (this->constant_string)._M_string_length = 0;
  (this->constant_string).field_2._M_local_buf[0] = '\0';
  this->constant_pattern = false;
  return;
}

Assistant:

RegexpBaseBindData::RegexpBaseBindData() : constant_pattern(false) {
}